

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O0

void __thiscall double_conversion::Bignum::ShiftLeft(Bignum *this,int shift_amount)

{
  int in_ESI;
  short *in_RDI;
  Bignum *unaff_retaddr;
  int local_shift;
  
  if (*in_RDI != 0) {
    in_RDI[1] = in_RDI[1] + (short)(in_ESI / 0x1c);
    EnsureCapacity(0);
    BigitsShiftLeft(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
  }
  return;
}

Assistant:

void Bignum::ShiftLeft(const int shift_amount) {
  if (used_bigits_ == 0) {
    return;
  }
  exponent_ += static_cast<int16_t>(shift_amount / kBigitSize);
  const int local_shift = shift_amount % kBigitSize;
  EnsureCapacity(used_bigits_ + 1);
  BigitsShiftLeft(local_shift);
}